

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O0

void lvm_debug(int ins_len)

{
  bool bVar1;
  ulong uVar2;
  reference pcVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_2b8 [32];
  size_t local_298;
  size_type temp_2;
  size_t local_270;
  size_type temp_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [32];
  uint local_228;
  allocator local_221;
  uint break_num;
  stringstream local_200 [8];
  stringstream ss;
  ostream local_1f0 [376];
  string local_78 [8];
  string break_adr;
  size_type temp;
  int local_48;
  allocator local_31;
  string local_30 [8];
  string str;
  int ins_len_local;
  
  if (!debug_flag) {
    printf(anon_var_dwarf_10004);
  }
  debug_flag = true;
  printf("IP--------->%08X\n",(ulong)registe_ptr->IP);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    std::operator<<((ostream *)&std::cout,">>>>");
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
      uVar2 = std::__cxx11::string::empty();
    } while ((uVar2 & 1) != 0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"n");
    if (bVar1) {
      lvm_debug_n(ins_len);
      local_48 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"e");
      if (bVar1) {
        lvm_debug_e();
        local_48 = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"c");
        if (bVar1) {
          lvm_debug_c();
          local_48 = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"u");
          if (bVar1) {
            lvm_debug_u();
            local_48 = 2;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"p");
            if (bVar1) {
              lvm_debug_p();
              local_48 = 2;
            }
            else {
              temp = std::__cxx11::string::begin();
              pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&temp);
              if (*pcVar3 == 'b') {
                lVar4 = std::__cxx11::string::find((char)local_30,0x20);
                if (lVar4 == -1) {
                  printf(anon_var_dwarf_1006c);
                  local_48 = 2;
                }
                else {
                  std::__cxx11::string::substr((ulong)local_78,(ulong)local_30);
                  std::__cxx11::stringstream::stringstream(local_200);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&break_num,"",&local_221);
                  std::__cxx11::stringstream::str((string *)local_200);
                  std::__cxx11::string::~string((string *)&break_num);
                  std::allocator<char>::~allocator((allocator<char> *)&local_221);
                  local_228 = 0;
                  std::__cxx11::string::substr((ulong)local_248,(ulong)local_78);
                  bVar1 = std::operator==(local_248,"0x");
                  std::__cxx11::string::~string((string *)local_248);
                  if (bVar1) {
                    poVar5 = (ostream *)std::ostream::operator<<(local_1f0,std::hex);
                    std::__cxx11::string::substr((ulong)&temp_1,(ulong)local_78);
                    std::operator<<(poVar5,(string *)&temp_1);
                    std::__cxx11::string::~string((string *)&temp_1);
                    std::istream::operator>>((istream *)local_200,&local_228);
                  }
                  else {
                    std::operator<<(local_1f0,local_78);
                    std::istream::operator>>((istream *)local_200,&local_228);
                  }
                  registe_ptr->R7 = local_228;
                  printf("R7--------->%08X\n",(ulong)registe_ptr->R7);
                  local_48 = 2;
                  std::__cxx11::stringstream::~stringstream(local_200);
                  std::__cxx11::string::~string(local_78);
                }
              }
              else {
                pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
                if ((*pcVar6 == 'd') &&
                   (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30),
                   *pcVar6 == 'b')) {
                  local_270 = std::__cxx11::string::find((char)local_30,0x20);
                  pcVar6 = data_ptr;
                  if (local_270 == 0xffffffffffffffff) {
                    printf(anon_var_dwarf_1006c);
                    local_48 = 2;
                  }
                  else {
                    std::__cxx11::string::string((string *)&temp_2,local_30);
                    lvm_debug_d_s(pcVar6,(string *)&temp_2,local_270);
                    std::__cxx11::string::~string((string *)&temp_2);
                    local_48 = 2;
                  }
                }
                else {
                  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
                  if ((*pcVar6 == 's') &&
                     (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30),
                     *pcVar6 == 'b')) {
                    local_298 = std::__cxx11::string::find((char)local_30,0x20);
                    pcVar6 = stack_ptr;
                    if (local_298 == 0xffffffffffffffff) {
                      printf(anon_var_dwarf_1006c);
                      local_48 = 2;
                    }
                    else {
                      std::__cxx11::string::string(local_2b8,local_30);
                      lvm_debug_d_s(pcVar6,(string *)local_2b8,local_298);
                      std::__cxx11::string::~string(local_2b8);
                      local_48 = 2;
                    }
                  }
                  else {
                    printf(anon_var_dwarf_10082);
                    local_48 = 2;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_30);
  } while (local_48 != 1);
  return;
}

Assistant:

void lvm_debug(int ins_len) {

	if (debug_flag != true) {
		printf("------------------------调试模式------------------------\n");
	}
	debug_flag = true;
	printf("IP--------->%08X\n", registe_ptr->IP);
FI:
	std::string str{ "" };
	std::cout << ">>>>";
YC:
	std::getline(std::cin, str);
	if (str.empty()) goto YC;
	if (str == "n")//单步
	{
		lvm_debug_n(ins_len);
		return;
	}
	else if (str == "e") {//退出调试
		lvm_debug_e();
		return;
	}
	else if (str == "c") {//运行程序
		lvm_debug_c();
		return;
	}
	else if (str == "u") {
		lvm_debug_u();
		goto FI;

	}
	else if (str == "p")//打印调试信息
	{
		lvm_debug_p();
		goto FI;//返回顶端
	}
	else if (*str.begin() == 'b') {
		auto temp = str.find(' ', 1);
		if (temp != std::string::npos) {
			std::string break_adr = str.substr(temp + 1);
			std::stringstream ss;
			ss.str("");
			unsigned break_num{ 0 };
			if (break_adr.substr(0, 2) == "0x")//16进制字符串
			{
				ss << std::hex << break_adr.substr(2);
				ss >> break_num;
			}
			else
			{
				ss << break_adr;
				ss >> break_num;
			}
			registe_ptr->R7 = break_num;
			printf("R7--------->%08X\n", registe_ptr->R7);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}
	else if (str[0] == 'd' && str[1] == 'b')
	{
		auto temp = str.find(' ', 2);
		if (temp != std::string::npos) {
			lvm_debug_d_s(data_ptr, str, temp);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}else if(str[0] == 's' && str[1] == 'b')
	{
		auto temp = str.find(' ', 2);
		if (temp != std::string::npos) {
			lvm_debug_d_s(stack_ptr,str,temp);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}
	else {
		printf("请输入正确的指令\n");
		goto FI;
	}

}